

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void __thiscall FPolyObj::UpdateLinks(FPolyObj *this)

{
  int key;
  line_t *plVar1;
  vertex_t *pvVar2;
  DVector2 DVar3;
  DVector2 DVar4;
  double dVar5;
  double dVar6;
  FLinePortal *pFVar7;
  uint uVar8;
  bool bVar9;
  bool *pbVar10;
  Node *pNVar11;
  uint i;
  ulong uVar12;
  FLinePortal *pFVar13;
  undefined4 uVar14;
  uint uVar15;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> processed;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> local_70;
  double local_58;
  double dStack_50;
  DVector2 local_48;
  
  if (this->bHasPortals == '\x02') {
    TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::TMap(&local_70);
    for (uVar12 = 0; uVar12 < (this->Linedefs).Count; uVar12 = uVar12 + 1) {
      bVar9 = line_t::isLinePortal((line_t *)(this->Linedefs).Array[uVar12]);
      uVar8 = linePortals.Count;
      pFVar7 = linePortals.Array;
      if (bVar9) {
        uVar15 = (this->Linedefs).Array[uVar12]->portalindex;
        pFVar13 = linePortals.Array + uVar15;
        if (linePortals.Count <= uVar15) {
          pFVar13 = (FLinePortal *)0x0;
        }
        if (pFVar13->mType == '\x03') {
          local_58 = (pFVar13->mDisplacement).X;
          dStack_50 = (pFVar13->mDisplacement).Y;
          plVar1 = pFVar13->mDestination;
          pvVar2 = pFVar13->mOrigin->v1;
          dVar5 = (plVar1->v2->p).X - (pvVar2->p).X;
          dVar6 = (plVar1->v2->p).Y - (pvVar2->p).Y;
          uVar14 = SUB84(dVar6,0);
          uVar15 = (uint)((ulong)dVar6 >> 0x20);
          DVar3.Y._0_4_ = uVar14;
          DVar3.X = dVar5;
          DVar3.Y._4_4_ = uVar15;
          pFVar13->mDisplacement = DVar3;
          if (pFVar7 != (FLinePortal *)0x0 && plVar1->portalindex < uVar8) {
            DVar4.Y._0_4_ = uVar14;
            DVar4.X = -dVar5;
            DVar4.Y._4_4_ = uVar15 ^ 0x80000000;
            pFVar7[plVar1->portalindex].mDisplacement = DVar4;
          }
          key = plVar1->frontsector->PortalGroup;
          pbVar10 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CheckKey(&local_70,key);
          if ((pbVar10 == (bool *)0x0) || (*pbVar10 == false)) {
            pNVar11 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::GetNode(&local_70,key)
            ;
            (pNVar11->Pair).Value = true;
            dVar5 = (pFVar13->mDisplacement).Y - dStack_50;
            local_48.Y._0_4_ = SUB84(dVar5,0);
            local_48.X = (pFVar13->mDisplacement).X - local_58;
            local_48.Y._4_4_ = (int)((ulong)dVar5 >> 0x20);
            FDisplacementTable::MoveGroup(&Displacements,key,&local_48);
          }
        }
      }
    }
    TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::~TMap(&local_70);
  }
  return;
}

Assistant:

void FPolyObj::UpdateLinks()
{
	if (bHasPortals == 2)
	{
		TMap<int, bool> processed;
		for (unsigned i = 0; i < Linedefs.Size(); i++)
		{
			if (Linedefs[i]->isLinePortal())
			{
				FLinePortal *port = Linedefs[i]->getPortal();
				if (port->mType == PORTT_LINKED)
				{
					DVector2 old = port->mDisplacement;
					port->mDisplacement = port->mDestination->v2->fPos() - port->mOrigin->v1->fPos();
					FLinePortal *port2 = port->mDestination->getPortal();
					if (port2) port2->mDisplacement = -port->mDisplacement;
					int destgroup = port->mDestination->frontsector->PortalGroup;
					bool *done = processed.CheckKey(destgroup);
					if (!done || !*done)
					{
						processed[destgroup] = true;
						DVector2 delta = port->mDisplacement - old;
						Displacements.MoveGroup(destgroup, delta);
					}
				}
			}
		}
	}
}